

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

char * my_stristr(char *string,char *pattern)

{
  __int32_t *p_Var1;
  __int32_t **pp_Var2;
  byte bVar3;
  long lVar4;
  
  bVar3 = *string;
  if (bVar3 != 0) {
    pp_Var2 = __ctype_toupper_loc();
    p_Var1 = *pp_Var2;
    do {
      if (p_Var1[bVar3] == p_Var1[(byte)*pattern]) {
        lVar4 = 0;
        bVar3 = *pattern;
        while (p_Var1[(byte)string[lVar4]] == p_Var1[bVar3]) {
          bVar3 = pattern[lVar4 + 1];
          lVar4 = lVar4 + 1;
          if (bVar3 == 0) {
            return string;
          }
        }
      }
      bVar3 = string[1];
      string = string + 1;
    } while (bVar3 != 0);
  }
  return (char *)0x0;
}

Assistant:

char *my_stristr(const char *string, const char *pattern)
{
	const char *pptr, *sptr;
	char *start;

	for (start = (char *)string; *start != 0; start++) {
		/* Find start of pattern in string */
		for ( ; ((*start != 0) && (toupper((unsigned char)*start) != toupper((unsigned char)*pattern))); start++)
			;
		if (*start == 0)
			return NULL;

		pptr = (const char *)pattern;
		sptr = (const char *)start;

		while (toupper((unsigned char)*sptr) == toupper((unsigned char)*pptr)) {
			sptr++;
			pptr++;

			/* If end of pattern then pattern was found */
			if (*pptr == 0)
				return (start);
		}
	}

	return NULL;
}